

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_auth.c
# Opt level: O2

ssize_t tnt_auth_raw(tnt_stream *s,char *user,int ulen,char *pass,int plen,char *base64_salt)

{
  uint64_t num;
  int iVar1;
  long lVar2;
  char *pcVar3;
  ssize_t sVar4;
  uint uVar5;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  uint32_t len;
  bool bVar9;
  undefined2 local_218;
  char local_216 [6];
  char body [64];
  char salt [64];
  uchar hash2 [20];
  undefined8 uStack_178;
  tnt_iheader hdr;
  undefined1 local_144 [8];
  char len_prefix [9];
  byte local_e8 [8];
  uchar hash1 [20];
  byte local_c8 [8];
  char scramble [20];
  undefined1 local_a8 [8];
  iovec v [6];
  
  len = 5;
  v[5].iov_len = (size_t)pass;
  if (user == (char *)0x0) {
    user = "guest";
    bVar9 = true;
  }
  else if (ulen == 5) {
    iVar1 = strncmp(user,"guest",5);
    bVar9 = iVar1 == 0;
    if (bVar9) {
      user = "guest";
    }
  }
  else {
    bVar9 = false;
    len = ulen;
  }
  num = s->reqid;
  s->reqid = num + 1;
  hdr.header[0x18] = '\0';
  hdr._25_7_ = 0;
  hdr.header[0] = '\0';
  hdr.header[1] = '\0';
  hdr.header[2] = '\0';
  hdr.header[3] = '\0';
  hdr.header[4] = '\0';
  hdr.header[5] = '\0';
  hdr.header[6] = '\0';
  hdr.header[7] = '\0';
  hdr.header[8] = '\0';
  hdr.header[9] = '\0';
  hdr.header[10] = '\0';
  hdr.header[0xb] = '\0';
  hdr.header[0xc] = '\0';
  hdr.header[0xd] = '\0';
  hdr.header[0xe] = '\0';
  hdr.header[0xf] = '\0';
  hdr.header[0x10] = '\0';
  hdr.header[0x11] = '\0';
  hdr.header[0x12] = '\0';
  hdr.header[0x13] = '\0';
  hdr.header[0x14] = '\0';
  hdr.header[0x15] = '\0';
  hdr.header[0x16] = '\0';
  hdr.header[0x17] = '\0';
  uStack_178 = 0x1070082;
  hdr._24_8_ = mp_encode_uint((char *)((long)&uStack_178 + 4),num);
  v[0].iov_len = (size_t)&uStack_178;
  v[1].iov_base = (void *)(hdr._24_8_ + -v[0].iov_len);
  local_218 = 0x2382;
  v[3].iov_len = (size_t)mp_encode_strl(local_216,len);
  v[1].iov_len = (size_t)&local_218;
  v[2].iov_base = (char *)(v[3].iov_len + -(long)&local_218);
  v[2].iov_len = (size_t)user;
  v[3].iov_base = (void *)(long)(int)len;
  *(char *)v[3].iov_len = '!';
  if (bVar9) {
    pcVar6 = (char *)(v[3].iov_len + 2);
    *(char *)(v[3].iov_len + 1) = -0x70;
    iVar1 = 5;
  }
  else {
    *(char *)(v[3].iov_len + 1) = -0x6e;
    *(char *)(v[3].iov_len + 2) = -0x57;
    *(char *)(v[3].iov_len + 3) = 'c';
    *(char *)(v[3].iov_len + 4) = 'h';
    *(char *)(v[3].iov_len + 5) = 'a';
    *(char *)(v[3].iov_len + 6) = 'p';
    *(char *)(v[3].iov_len + 7) = '-';
    *(char *)(v[3].iov_len + 8) = 's';
    *(char *)(v[3].iov_len + 9) = 'h';
    *(char *)(v[3].iov_len + 10) = 'a';
    *(char *)(v[3].iov_len + 0xb) = '1';
    *(char *)(v[3].iov_len + 0xc) = -0x4c;
    base64_decode(base64_salt,0x2c,body + 0x38,0x40);
    SHA1Init((SHA1_CTX *)local_144);
    SHA1Update((SHA1_CTX *)local_144,(uchar *)v[5].iov_len,plen);
    SHA1Final(local_e8,(SHA1_CTX *)local_144);
    SHA1Init((SHA1_CTX *)local_144);
    SHA1Update((SHA1_CTX *)local_144,local_e8,0x14);
    SHA1Final((uchar *)(salt + 0x38),(SHA1_CTX *)local_144);
    SHA1Init((SHA1_CTX *)local_144);
    SHA1Update((SHA1_CTX *)local_144,(uchar *)(body + 0x38),0x14);
    SHA1Update((SHA1_CTX *)local_144,(uchar *)(salt + 0x38),0x14);
    SHA1Final(local_c8,(SHA1_CTX *)local_144);
    for (lVar2 = 0; lVar2 != 0x14; lVar2 = lVar2 + 1) {
      local_c8[lVar2] = local_c8[lVar2] ^ local_e8[lVar2];
    }
    pcVar6 = (char *)(v[3].iov_len + 0xd);
    v[4].iov_len = (size_t)local_c8;
    v[5].iov_base = (void *)0x14;
    iVar1 = 6;
  }
  pcVar3 = len_prefix + 1;
  v[4].iov_base = pcVar6 + -v[3].iov_len;
  uVar7 = 0;
  for (uVar8 = 0x10; (uint)(iVar1 << 4) != uVar8; uVar8 = uVar8 + 0x10) {
    uVar7 = uVar7 + *(long *)((long)&v[0].iov_base + uVar8);
  }
  if (uVar7 >> 0x20 == 0) {
    uVar5 = (uint)uVar7;
    stack0xfffffffffffffebd =
         CONCAT44(stack0xfffffffffffffec1,
                  uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18);
    local_144[0] = 0xce;
    pcVar3 = local_144 + 5;
  }
  else {
    register0x00000030 =
         uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 | (uVar7 & 0xff0000000000) >> 0x18 |
         (uVar7 & 0xff00000000) >> 8 | (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
         (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
    local_144[0] = 0xcf;
  }
  local_a8 = (undefined1  [8])local_144;
  v[0].iov_base = pcVar3 + -(long)local_a8;
  sVar4 = (*s->writev)(s,(iovec *)local_a8,iVar1);
  return sVar4;
}

Assistant:

ssize_t
tnt_auth_raw(struct tnt_stream *s, const char *user, int ulen,
	     const char *pass, int plen, const char *base64_salt)
{
	struct tnt_iheader hdr;
	struct iovec v[6]; int v_sz = 5;
	char *data = NULL, *body_start = NULL;
	int guest = !user || (ulen == 5 && !strncmp(user, "guest", 5));
	if (guest) {
		user = "guest";
		ulen = 5;
	}
	encode_header(&hdr, TNT_OP_AUTH, s->reqid++);
	v[1].iov_base = (void *)hdr.header;
	v[1].iov_len  = hdr.end - hdr.header;
	char body[64]; data = body; body_start = data;

	data = mp_encode_map(data, 2);
	data = mp_encode_uint(data, TNT_USERNAME);
	data = mp_encode_strl(data, ulen);
	v[2].iov_base = body_start;
	v[2].iov_len  = data - body_start;
	v[3].iov_base = (void *)user;
	v[3].iov_len  = ulen;
	body_start = data;
	data = mp_encode_uint(data, TNT_TUPLE);
	char salt[64], scramble[TNT_SCRAMBLE_SIZE];
	if (!guest) {
		data = mp_encode_array(data, 2);
		data = mp_encode_str(data, "chap-sha1", strlen("chap-sha1"));
		data = mp_encode_strl(data, TNT_SCRAMBLE_SIZE);
		base64_decode(base64_salt, TNT_SALT_SIZE, salt, 64);
		tnt_scramble_prepare(scramble, salt, pass, plen);
		v[5].iov_base = scramble;
		v[5].iov_len  = TNT_SCRAMBLE_SIZE;
		v_sz++;
	} else {
		data = mp_encode_array(data, 0);
	}
	v[4].iov_base = body_start;
	v[4].iov_len  = data - body_start;

	size_t package_len = 0;
	for (int i = 1; i < v_sz; ++i) {
		package_len += v[i].iov_len;
	}
	char len_prefix[9];
	char *len_end = mp_encode_luint32(len_prefix, package_len);
	v[0].iov_base = len_prefix;
	v[0].iov_len = len_end - len_prefix;
	return s->writev(s, v, v_sz);
}